

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_stream.hpp
# Opt level: O0

char_t __thiscall
cfgfile::input_stream_t<cfgfile::qstring_trait_t>::get
          (input_stream_t<cfgfile::qstring_trait_t> *this)

{
  bool bVar1;
  reference pvVar2;
  QChar *pQVar3;
  value_type *in_RDI;
  pos_t unaff_retaddr;
  buf_t *in_stack_00000008;
  istream_t *in_stack_00000010;
  char_t ch;
  QChar *in_stack_ffffffffffffffe0;
  stack<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::deque<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>_>
  *this_00;
  input_stream_t<cfgfile::qstring_trait_t> *in_stack_ffffffffffffffe8;
  value_type *ch_00;
  undefined6 in_stack_fffffffffffffff8;
  char16_t in_stack_fffffffffffffffe;
  
  ch_00 = in_RDI;
  bVar1 = at_end(in_stack_ffffffffffffffe8);
  if (bVar1) {
    QChar::QChar(in_stack_ffffffffffffffe0,(int)((ulong)in_RDI >> 0x20));
  }
  else {
    this_00 = (stack<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::deque<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>_>
               *)in_RDI[1].m_column_number;
    std::
    stack<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::deque<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>_>
    ::push(this_00,in_RDI);
    in_RDI[1].m_column_number = in_RDI[1].m_column_number + 1;
    QChar::QChar((QChar *)this_00,(int)((ulong)in_RDI >> 0x20));
    bVar1 = std::stack<QChar,_std::deque<QChar,_std::allocator<QChar>_>_>::empty
                      ((stack<QChar,_std::deque<QChar,_std::allocator<QChar>_>_> *)0x172c22);
    if (bVar1) {
      if (in_RDI[0xe].m_line_number == 0x200) {
        qstring_trait_t::fill_buf
                  (in_stack_00000010,in_stack_00000008,unaff_retaddr,
                   (pos_t *)CONCAT26(in_stack_fffffffffffffffe,in_stack_fffffffffffffff8),
                   (pos_t)ch_00);
        in_RDI[0xe].m_line_number = 0;
      }
      pQVar3 = QString::operator[]((QString *)this_00,(qsizetype)in_RDI);
      in_stack_fffffffffffffffe = pQVar3->ucs;
      in_RDI[0xe].m_line_number = in_RDI[0xe].m_line_number + 1;
      bVar1 = is_new_line((input_stream_t<cfgfile::qstring_trait_t> *)
                          CONCAT26(in_stack_fffffffffffffffe,in_stack_fffffffffffffff8),
                          (char_t *)ch_00);
      if (bVar1) {
        in_RDI->m_line_number = in_RDI->m_line_number + 1;
        in_RDI[1].m_column_number = 1;
      }
    }
    else {
      pvVar2 = std::stack<QChar,_std::deque<QChar,_std::allocator<QChar>_>_>::top
                         ((stack<QChar,_std::deque<QChar,_std::allocator<QChar>_>_> *)0x172c36);
      in_stack_fffffffffffffffe = pvVar2->ucs;
      std::stack<QChar,_std::deque<QChar,_std::allocator<QChar>_>_>::pop
                ((stack<QChar,_std::deque<QChar,_std::allocator<QChar>_>_> *)0x172c4e);
      bVar1 = is_new_line((input_stream_t<cfgfile::qstring_trait_t> *)
                          CONCAT26(in_stack_fffffffffffffffe,in_stack_fffffffffffffff8),
                          (char_t *)ch_00);
      if (bVar1) {
        in_RDI->m_line_number = in_RDI->m_line_number + 1;
        in_RDI[1].m_column_number = 1;
      }
    }
  }
  return (char_t)in_stack_fffffffffffffffe;
}

Assistant:

typename Trait::char_t get()
	{
		if( !at_end() )
		{
			m_prev_positions.push( { m_column_number, m_line_number } );

			m_column_number += 1;

			typename Trait::char_t ch( 0x00 );

			if( !m_returned_char.empty() )
			{
				ch = m_returned_char.top();

				m_returned_char.pop();

				if( is_new_line( ch ) )
				{
					m_line_number += 1;
					m_column_number = 1;
				}

				return ch;
			}

			if( m_buf_pos == c_buff_size )
			{
				Trait::fill_buf( m_stream, m_buf, c_buff_size, m_stream_pos, m_stream_size );
				m_buf_pos = 0;
			}

			ch = m_buf[ m_buf_pos ];

			++m_buf_pos;

			if( is_new_line( ch ) )
			{
				m_line_number += 1;
				m_column_number = 1;
			}

			return ch;
		}
		else
			return typename Trait::char_t( 0x00 );
	}